

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

shared_ptr<duckdb::ParquetKeys,_true>
duckdb::shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetKeys>
          (shared_ptr<duckdb::ObjectCacheEntry,_true> *src)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<duckdb::ParquetKeys,_true> sVar1;
  shared_ptr<duckdb::ObjectCacheEntry> *__r;
  shared_ptr<duckdb::ParquetKeys,_true> *in_stack_ffffffffffffffd0;
  shared_ptr<duckdb::ObjectCacheEntry> local_20 [2];
  
  __r = local_20;
  ::std::static_pointer_cast<duckdb::ParquetKeys,duckdb::ObjectCacheEntry>(__r);
  shared_ptr<duckdb::ParquetKeys,_true>::shared_ptr
            (in_stack_ffffffffffffffd0,(shared_ptr<duckdb::ParquetKeys> *)__r);
  ::std::shared_ptr<duckdb::ParquetKeys>::~shared_ptr((shared_ptr<duckdb::ParquetKeys> *)0x23228c4);
  sVar1.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI
  ;
  return (shared_ptr<duckdb::ParquetKeys,_true>)
         sVar1.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<TGT> shared_ptr_cast(shared_ptr<SRC> src) { // NOLINT: mimic std style
	return shared_ptr<TGT>(std::static_pointer_cast<TGT, SRC>(src.internal));
}